

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::EntryCompile(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t csz;
  int iVar5;
  int iVar6;
  charcount_t cszOpts;
  BOOL BVar7;
  undefined4 *puVar8;
  JavascriptRegExp *pJVar9;
  Var pvVar10;
  JavascriptRegExp *pJVar11;
  RecyclableObject *pRVar12;
  JavascriptString *pJVar13;
  undefined4 extraout_var;
  RegexPattern *ptr;
  undefined4 extraout_var_00;
  RegexPattern *ptr_00;
  int in_stack_00000010;
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  char16 *pszOpts;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x222,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bb0da3;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_50,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar9 = GetJavascriptRegExp((Arguments *)&callInfo_local,L"RegExp.prototype.compile",pSVar2);
  if ((local_50._0_4_ & 0xffffff) == 1) {
    ptr = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->emptyRegexPattern).ptr;
    ptr_00 = (RegexPattern *)0x0;
    goto LAB_00bb0ca5;
  }
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  bVar4 = VarIs<Js::JavascriptRegExp>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  if (bVar4) {
    pJVar11 = VarTo<Js::JavascriptRegExp>(pvVar10);
    ptr = (pJVar11->pattern).ptr;
    ptr_00 = (pJVar11->splitPattern).ptr;
    if (2 < (local_50._0_4_ & 0xffffff)) {
      pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      if (pvVar10 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00bb0da3;
        *puVar8 = 0;
      }
      bVar4 = TaggedInt::Is(pvVar10);
      if (((ulong)pvVar10 >> 0x32 == 0) && (!bVar4)) {
        pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
        if (pRVar12 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00bb0da3;
          *puVar8 = 0;
        }
        TVar1 = ((pRVar12->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) goto LAB_00bb0ca5;
        }
        else {
          BVar7 = RecyclableObject::IsExternal(pRVar12);
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_00bb0da3;
            *puVar8 = 0;
          }
        }
      }
      JavascriptError::ThrowSyntaxError(pSVar2,-0x7ff5ec67,(PCWSTR)0x0);
    }
    goto LAB_00bb0ca5;
  }
  bVar4 = VarIs<Js::JavascriptString>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  if (bVar4) {
    pJVar13 = VarTo<Js::JavascriptString>(pvVar10);
  }
  else {
    if (pvVar10 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00bb0da3;
      *puVar8 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar10);
    if ((ulong)pvVar10 >> 0x32 == 0 && !bVar4) {
      pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
      if (pRVar12 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00bb0da3;
        *puVar8 = 0;
      }
      TVar1 = ((pRVar12->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) {
          pJVar13 = JavascriptLibrary::GetEmptyString
                              ((pSVar2->super_ScriptContextBase).javascriptLibrary);
          goto LAB_00bb0c43;
        }
      }
      else {
        BVar7 = RecyclableObject::IsExternal(pRVar12);
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_00bb0da3:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
      }
    }
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    pJVar13 = JavascriptConversion::ToString(pvVar10,pSVar2);
  }
LAB_00bb0c43:
  csz = JavascriptString::GetLength(pJVar13);
  iVar5 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar13);
  if ((local_50._0_4_ & 0xffffff) < 3) {
LAB_00bb0c85:
    cszOpts = 0;
    pszOpts = (char16 *)0x0;
  }
  else {
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    BVar7 = JavascriptOperators::IsUndefinedObject(pvVar10);
    if (BVar7 != 0) goto LAB_00bb0c85;
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    bVar4 = VarIs<Js::JavascriptString>(pvVar10);
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,2);
    if (bVar4) {
      pJVar13 = VarTo<Js::JavascriptString>(pvVar10);
    }
    else {
      pJVar13 = JavascriptConversion::ToString(pvVar10,pSVar2);
    }
    iVar6 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar13);
    pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar6);
    cszOpts = JavascriptString::GetLength(pJVar13);
  }
  ptr_00 = (RegexPattern *)0x0;
  ptr = RegexHelper::CompileDynamic
                  (pSVar2,(char16 *)CONCAT44(extraout_var,iVar5),csz,pszOpts,cszOpts,false);
LAB_00bb0ca5:
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(&pJVar9->pattern,ptr);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierSet(&pJVar9->splitPattern,ptr_00)
  ;
  (pJVar9->lastIndexVar).ptr = (void *)0x0;
  pJVar9->lastIndexOrFlag = 0;
  return pJVar9;
}

Assistant:

Var JavascriptRegExp::EntryCompile(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptRegExp* thisRegularExpression = GetJavascriptRegExp(args, _u("RegExp.prototype.compile"), scriptContext);

        UnifiedRegex::RegexPattern* pattern;
        UnifiedRegex::RegexPattern* splitPattern = nullptr;

        if (callInfo.Count == 1 )
        {
            pattern = scriptContext->GetLibrary()->GetEmptyRegexPattern();
        }
        else if (VarIs<JavascriptRegExp>(args[1]))
        {
            JavascriptRegExp* source = VarTo<JavascriptRegExp>(args[1]);
            //compile with a regular expression
            pattern = source->GetPattern();
            splitPattern = source->GetSplitPattern();
            // second arg must be undefined if a reg expression is passed
            if(callInfo.Count > 2 &&  JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JavascriptError::ThrowSyntaxError(scriptContext, JSERR_RegExpSyntax);
            }
        }
        else
        {
            //compile with a string
            JavascriptString * strBody;
            if (VarIs<JavascriptString>(args[1]))
            {
                strBody = VarTo<JavascriptString>(args[1]);
            }
            else if(JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
            {
                strBody = scriptContext->GetLibrary()->GetEmptyString();
            }
            else
            {
                strBody = JavascriptConversion::ToString(args[1], scriptContext);
            }

            int cBody = strBody->GetLength();
            const char16 *szRegex = strBody->GetSz(); // must be null terminated!
            int cOpts = 0;
            const char16 *szOptions = nullptr;

            JavascriptString * strOptions = nullptr;
            if (callInfo.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
            {
                if (VarIs<JavascriptString>(args[2]))
                {
                    strOptions = VarTo<JavascriptString>(args[2]);
                }
                else
                {
                    strOptions = JavascriptConversion::ToString(args[2], scriptContext);
                }

                szOptions = strOptions->GetSz(); // must be null terminated!
                cOpts = strOptions->GetLength();
            }

            pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);
        }

        thisRegularExpression->SetPattern(pattern);
        thisRegularExpression->SetSplitPattern(splitPattern);
        thisRegularExpression->SetLastIndex(0);
        return thisRegularExpression;
    }